

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_interface_block(CompilerGLSL *this,SPIRVariable *var)

{
  uint uVar1;
  bool bVar2;
  byte bVar3;
  uint32_t uVar4;
  int iVar5;
  mapped_type *pmVar6;
  undefined4 extraout_var;
  ulong uVar7;
  SPIRType *pSVar8;
  SPIREntryPoint *pSVar9;
  uint *puVar10;
  bool *pbVar11;
  Vector<std::function<void_()>_> *this_00;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar12;
  bool local_386;
  bool local_385;
  bool local_329;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_328;
  byte local_302;
  anon_class_16_2_633bb654 local_2f0;
  function<void_()> local_2e0;
  SPIRFunction *local_2c0;
  SPIRFunction *entry_func;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278 [32];
  undefined1 local_258 [35];
  bool local_235;
  uint local_234;
  ID IStack_230;
  bool old_array_size_literal;
  uint32_t old_array_size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228 [7];
  bool control_point_input_array;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208 [32];
  spirv_cross local_1e8 [39];
  allocator local_1c1;
  string local_1c0 [32];
  TypedID *local_1a0;
  TypedID<(spirv_cross::Types)1> *member;
  TypedID<(spirv_cross::Types)1> *__end3;
  TypedID<(spirv_cross::Types)1> *__begin3;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *__range3;
  undefined1 local_178 [4];
  uint32_t i;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_158;
  undefined1 local_150;
  spirv_cross local_148 [32];
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_128;
  char local_120;
  uint local_114;
  string local_110 [32];
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_f0;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_e8;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_e0;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *block_namespace;
  string block_name;
  allocator local_b1;
  string local_b0 [37];
  byte local_8b;
  byte local_8a;
  allocator local_89;
  string local_88 [55];
  allocator local_51;
  string local_50 [32];
  char *local_30;
  char *qual;
  SPIRType *pSStack_20;
  bool block;
  SPIRType *type;
  SPIRVariable *var_local;
  CompilerGLSL *this_local;
  
  type = (SPIRType *)var;
  var_local = (SPIRVariable *)this;
  uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).field_0xc);
  pSStack_20 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar4);
  pmVar6 = ::std::
           unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
           ::operator[](&(this->super_Compiler).ir.meta,&(pSStack_20->super_IVariant).self);
  qual._7_1_ = Bitset::get(&(pmVar6->decoration).decoration_flags,2);
  iVar5 = (*(this->super_Compiler)._vptr_Compiler[0x2c])(this,type);
  local_30 = (char *)CONCAT44(extraout_var,iVar5);
  if ((qual._7_1_ & 1) == 0) {
    if ((*(int *)&(pSStack_20->super_IVariant).field_0xc == 0xf) &&
       (((((this->options).force_flattened_io_blocks & 1U) != 0 ||
         ((((this->options).es & 1U) != 0 && ((this->options).version < 0x136)))) ||
        ((((this->options).es & 1U) == 0 && ((this->options).version < 0x96)))))) {
      emit_flattened_io_block(this,(SPIRVariable *)type,local_30);
    }
    else {
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
      add_resource_name(this,uVar4);
      local_385 = false;
      if (pSStack_20->storage == StorageClassInput) {
        bVar2 = VectorView<unsigned_int>::empty(&(pSStack_20->array).super_VectorView<unsigned_int>)
        ;
        local_385 = false;
        if (!bVar2) {
          IStack_230.id = (type->super_IVariant).self.id;
          bVar2 = Compiler::has_decoration(&this->super_Compiler,IStack_230,DecorationPatch);
          local_385 = false;
          if (!bVar2) {
            pSVar9 = Compiler::get_entry_point(&this->super_Compiler);
            local_386 = true;
            if (pSVar9->model != ExecutionModelTessellationControl) {
              pSVar9 = Compiler::get_entry_point(&this->super_Compiler);
              local_386 = pSVar9->model == ExecutionModelTessellationEvaluation;
            }
            local_385 = local_386;
          }
        }
      }
      old_array_size._3_1_ = local_385;
      local_234 = 0;
      local_235 = true;
      if (local_385 != false) {
        puVar10 = VectorView<unsigned_int>::back
                            (&(pSStack_20->array).super_VectorView<unsigned_int>);
        ::std::swap<unsigned_int>(puVar10,&local_234);
        pbVar11 = VectorView<bool>::back(&(pSStack_20->array_size_literal).super_VectorView<bool>);
        ::std::swap<bool>(pbVar11,&local_235);
      }
      layout_for_variable_abi_cxx11_((CompilerGLSL *)local_258,(SPIRVariable *)this);
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
      (*(this->super_Compiler)._vptr_Compiler[0x2b])(local_278,this,(ulong)uVar4);
      pSVar8 = pSStack_20;
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
      (*(this->super_Compiler)._vptr_Compiler[6])(&entry_func,this,(ulong)uVar4,1);
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
      (*(this->super_Compiler)._vptr_Compiler[0x1a])(local_298,this,pSVar8,&entry_func,(ulong)uVar4)
      ;
      statement<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,char_const(&)[2]>
                (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258
                 ,local_278,local_298,(char (*) [2])0x4d9ce2);
      ::std::__cxx11::string::~string((string *)local_298);
      ::std::__cxx11::string::~string((string *)&entry_func);
      ::std::__cxx11::string::~string((string *)local_278);
      ::std::__cxx11::string::~string((string *)local_258);
      if ((old_array_size._3_1_ & 1) != 0) {
        puVar10 = VectorView<unsigned_int>::back
                            (&(pSStack_20->array).super_VectorView<unsigned_int>);
        ::std::swap<unsigned_int>(puVar10,&local_234);
        pbVar11 = VectorView<bool>::back(&(pSStack_20->array_size_literal).super_VectorView<bool>);
        ::std::swap<bool>(pbVar11,&local_235);
      }
      if ((type->width == 3) &&
         (uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&type->columns), uVar4 != 0)) {
        uVar4 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&(this->super_Compiler).ir.default_entry_point);
        local_2c0 = Compiler::get<spirv_cross::SPIRFunction>(&this->super_Compiler,uVar4);
        this_00 = &local_2c0->fixup_hooks_in;
        local_2f0.var = (SPIRVariable *)type;
        local_2f0.this = this;
        ::std::function<void()>::
        function<spirv_cross::CompilerGLSL::emit_interface_block(spirv_cross::SPIRVariable_const&)::__0,void>
                  ((function<void()> *)&local_2e0,&local_2f0);
        SmallVector<std::function<void_()>,_0UL>::push_back(this_00,&local_2e0);
        ::std::function<void_()>::~function(&local_2e0);
      }
    }
  }
  else if (((((this->options).force_flattened_io_blocks & 1U) == 0) &&
           ((((this->options).es & 1U) == 0 || (0x135 < (this->options).version)))) &&
          ((((this->options).es & 1U) != 0 || (0x95 < (this->options).version)))) {
    if ((((this->options).es & 1U) != 0) && ((this->options).version < 0x140)) {
      ::std::allocator<char>::allocator();
      local_8a = 0;
      local_8b = 0;
      ::std::__cxx11::string::string(local_50,"GL_EXT_geometry_shader",&local_51);
      bVar2 = has_extension(this,(string *)local_50);
      local_302 = 0;
      if (!bVar2) {
        ::std::allocator<char>::allocator();
        local_8a = 1;
        ::std::__cxx11::string::string(local_88,"GL_EXT_tessellation_shader",&local_89);
        local_8b = 1;
        bVar2 = has_extension(this,(string *)local_88);
        local_302 = bVar2 ^ 0xff;
      }
      if ((local_8b & 1) != 0) {
        ::std::__cxx11::string::~string(local_88);
      }
      if ((local_8a & 1) != 0) {
        ::std::allocator<char>::~allocator((allocator<char> *)&local_89);
      }
      ::std::__cxx11::string::~string(local_50);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_51);
      if ((local_302 & 1) != 0) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_b0,"GL_EXT_shader_io_blocks",&local_b1);
        require_extension_internal(this,(string *)local_b0);
        ::std::__cxx11::string::~string(local_b0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_b1);
      }
    }
    uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSStack_20->super_IVariant).self);
    (*(this->super_Compiler)._vptr_Compiler[6])(&block_namespace,this,(ulong)uVar4,0);
    if (pSStack_20->storage == StorageClassInput) {
      local_328 = &this->block_input_names;
    }
    else {
      local_328 = &this->block_output_names;
    }
    local_e0 = local_328;
    bVar3 = ::std::__cxx11::string::empty();
    local_329 = true;
    if ((bVar3 & 1) == 0) {
      local_e8._M_cur =
           (__node_type *)
           ::std::
           unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find(local_e0,(key_type *)&block_namespace);
      local_f0._M_cur =
           (__node_type *)
           ::std::
           end<std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                     (local_e0);
      local_329 = ::std::__detail::operator!=(&local_e8,&local_f0);
    }
    if (local_329 == false) {
      pVar12 = ::std::
               unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::insert(local_e0,(value_type *)&block_namespace);
      local_128._M_cur =
           (__node_type *)
           pVar12.first.
           super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ._M_cur;
      local_120 = pVar12.second;
    }
    else {
      local_114 = (pSStack_20->super_IVariant).self.id;
      (*(this->super_Compiler)._vptr_Compiler[3])(local_110,this,(ulong)local_114);
      ::std::__cxx11::string::operator=((string *)&block_namespace,local_110);
      ::std::__cxx11::string::~string(local_110);
    }
    uVar7 = ::std::__cxx11::string::empty();
    if ((uVar7 & 1) != 0) {
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).field_0xc);
      pSVar8 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar4);
      join<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>&,char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>const&>
                (local_148,(char (*) [2])0x4e3b4c,&(pSVar8->super_IVariant).self,
                 (char (*) [2])0x4e3b4c,&(type->super_IVariant).self);
      ::std::__cxx11::string::operator=((string *)&block_namespace,(string *)local_148);
      ::std::__cxx11::string::~string((string *)local_148);
    }
    pVar12 = ::std::
             unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::insert(&this->resource_names,(value_type *)&block_namespace);
    local_158._M_cur =
         (__node_type *)
         pVar12.first.
         super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
         ._M_cur;
    local_150 = pVar12.second;
    layout_for_variable_abi_cxx11_((CompilerGLSL *)local_178,(SPIRVariable *)this);
    statement<std::__cxx11::string,char_const*&,std::__cxx11::string&>
              (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178,
               &local_30,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&block_namespace
              );
    ::std::__cxx11::string::~string((string *)local_178);
    begin_scope(this);
    ::std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&pSStack_20->member_name_cache);
    __range3._4_4_ = 0;
    __begin3 = (TypedID<(spirv_cross::Types)1> *)&pSStack_20->member_types;
    __end3 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::begin
                       ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)__begin3);
    member = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::end
                       ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)__begin3);
    for (; __end3 != member; __end3 = __end3 + 1) {
      local_1a0 = (TypedID *)__end3;
      add_member_name(this,pSStack_20,__range3._4_4_);
      pSVar8 = pSStack_20;
      uVar4 = TypedID::operator_cast_to_unsigned_int(local_1a0);
      uVar1 = __range3._4_4_;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1c0,"",&local_1c1);
      (*(this->super_Compiler)._vptr_Compiler[0x15])
                (this,pSVar8,(ulong)uVar4,(ulong)uVar1,local_1c0,0);
      ::std::__cxx11::string::~string(local_1c0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
      __range3._4_4_ = __range3._4_4_ + 1;
    }
    uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
    add_resource_name(this,uVar4);
    uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
    (*(this->super_Compiler)._vptr_Compiler[6])(local_208,this,(ulong)uVar4,1);
    (*(this->super_Compiler)._vptr_Compiler[0x23])(local_228,this,pSStack_20);
    join<std::__cxx11::string,std::__cxx11::string>(local_1e8,local_208,local_228);
    end_scope_decl(this,(string *)local_1e8);
    ::std::__cxx11::string::~string((string *)local_1e8);
    ::std::__cxx11::string::~string((string *)local_228);
    ::std::__cxx11::string::~string((string *)local_208);
    statement<char_const(&)[1]>(this,(char (*) [1])0x4d8596);
    ::std::__cxx11::string::~string((string *)&block_namespace);
  }
  else {
    emit_flattened_io_block(this,(SPIRVariable *)type,local_30);
  }
  return;
}

Assistant:

void CompilerGLSL::emit_interface_block(const SPIRVariable &var)
{
	auto &type = get<SPIRType>(var.basetype);

	// Either make it plain in/out or in/out blocks depending on what shader is doing ...
	bool block = ir.meta[type.self].decoration.decoration_flags.get(DecorationBlock);
	const char *qual = to_storage_qualifiers_glsl(var);

	if (block)
	{
		// ESSL earlier than 310 and GLSL earlier than 150 did not support
		// I/O variables which are struct types.
		// To support this, flatten the struct into separate varyings instead.
		if (options.force_flattened_io_blocks || (options.es && options.version < 310) ||
		    (!options.es && options.version < 150))
		{
			// I/O blocks on ES require version 310 with Android Extension Pack extensions, or core version 320.
			// On desktop, I/O blocks were introduced with geometry shaders in GL 3.2 (GLSL 150).
			emit_flattened_io_block(var, qual);
		}
		else
		{
			if (options.es && options.version < 320)
			{
				// Geometry and tessellation extensions imply this extension.
				if (!has_extension("GL_EXT_geometry_shader") && !has_extension("GL_EXT_tessellation_shader"))
					require_extension_internal("GL_EXT_shader_io_blocks");
			}

			// Block names should never alias.
			auto block_name = to_name(type.self, false);

			// The namespace for I/O blocks is separate from other variables in GLSL.
			auto &block_namespace = type.storage == StorageClassInput ? block_input_names : block_output_names;

			// Shaders never use the block by interface name, so we don't
			// have to track this other than updating name caches.
			if (block_name.empty() || block_namespace.find(block_name) != end(block_namespace))
				block_name = get_fallback_name(type.self);
			else
				block_namespace.insert(block_name);

			// If for some reason buffer_name is an illegal name, make a final fallback to a workaround name.
			// This cannot conflict with anything else, so we're safe now.
			if (block_name.empty())
				block_name = join("_", get<SPIRType>(var.basetype).self, "_", var.self);

			// Instance names cannot alias block names.
			resource_names.insert(block_name);

			statement(layout_for_variable(var), qual, block_name);
			begin_scope();

			type.member_name_cache.clear();

			uint32_t i = 0;
			for (auto &member : type.member_types)
			{
				add_member_name(type, i);
				emit_struct_member(type, member, i);
				i++;
			}

			add_resource_name(var.self);
			end_scope_decl(join(to_name(var.self), type_to_array_glsl(type)));
			statement("");
		}
	}
	else
	{
		// ESSL earlier than 310 and GLSL earlier than 150 did not support
		// I/O variables which are struct types.
		// To support this, flatten the struct into separate varyings instead.
		if (type.basetype == SPIRType::Struct &&
		    (options.force_flattened_io_blocks || (options.es && options.version < 310) ||
		     (!options.es && options.version < 150)))
		{
			emit_flattened_io_block(var, qual);
		}
		else
		{
			add_resource_name(var.self);

			// Tessellation control and evaluation shaders must have either gl_MaxPatchVertices or unsized arrays for input arrays.
			// Opt for unsized as it's the more "correct" variant to use.
			bool control_point_input_array = type.storage == StorageClassInput && !type.array.empty() &&
			                                 !has_decoration(var.self, DecorationPatch) &&
			                                 (get_entry_point().model == ExecutionModelTessellationControl ||
			                                  get_entry_point().model == ExecutionModelTessellationEvaluation);

			uint32_t old_array_size = 0;
			bool old_array_size_literal = true;

			if (control_point_input_array)
			{
				swap(type.array.back(), old_array_size);
				swap(type.array_size_literal.back(), old_array_size_literal);
			}

			statement(layout_for_variable(var), to_qualifiers_glsl(var.self),
			          variable_decl(type, to_name(var.self), var.self), ";");

			if (control_point_input_array)
			{
				swap(type.array.back(), old_array_size);
				swap(type.array_size_literal.back(), old_array_size_literal);
			}

			// If a StorageClassOutput variable has an initializer, we need to initialize it in main().
			if (var.storage == StorageClassOutput && var.initializer)
			{
				auto &entry_func = this->get<SPIRFunction>(ir.default_entry_point);
				entry_func.fixup_hooks_in.push_back(
				    [&]() { statement(to_name(var.self), " = ", to_expression(var.initializer), ";"); });
			}
		}
	}
}